

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator.cpp
# Opt level: O1

void __thiscall duckdb::PhysicalOperator::Verify(PhysicalOperator *this)

{
  return;
}

Assistant:

void PhysicalOperator::Verify() {
#ifdef DEBUG
	auto sources = GetSources();
	D_ASSERT(!sources.empty());
	for (auto &child : children) {
		child.get().Verify();
	}
#endif
}